

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_hd.c
# Opt level: O0

int nghttp2_hd_deflate_change_table_size
              (nghttp2_hd_deflater *deflater,size_t settings_max_dynamic_table_size)

{
  size_t local_30;
  ulong local_28;
  size_t next_bufsize;
  size_t settings_max_dynamic_table_size_local;
  nghttp2_hd_deflater *deflater_local;
  
  local_28 = settings_max_dynamic_table_size;
  if (deflater->deflate_hd_table_bufsize_max <= settings_max_dynamic_table_size) {
    local_28 = deflater->deflate_hd_table_bufsize_max;
  }
  (deflater->ctx).hd_table_bufsize_max = local_28;
  if (deflater->min_hd_table_bufsize_max < local_28) {
    local_30 = deflater->min_hd_table_bufsize_max;
  }
  else {
    local_30 = local_28;
  }
  deflater->min_hd_table_bufsize_max = local_30;
  deflater->notify_table_size_change = '\x01';
  hd_context_shrink_table_size(&deflater->ctx,&deflater->map);
  return 0;
}

Assistant:

int nghttp2_hd_deflate_change_table_size(
    nghttp2_hd_deflater *deflater, size_t settings_max_dynamic_table_size) {
  size_t next_bufsize = nghttp2_min(settings_max_dynamic_table_size,
                                    deflater->deflate_hd_table_bufsize_max);

  deflater->ctx.hd_table_bufsize_max = next_bufsize;

  deflater->min_hd_table_bufsize_max =
      nghttp2_min(deflater->min_hd_table_bufsize_max, next_bufsize);

  deflater->notify_table_size_change = 1;

  hd_context_shrink_table_size(&deflater->ctx, &deflater->map);
  return 0;
}